

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

json * __thiscall
anon_unknown.dwarf_8d4d0::schema_ref::default_value
          (schema_ref *this,json_pointer *ptr,json *instance,error_handler *e)

{
  int iVar1;
  undefined4 extraout_var;
  shared_ptr<(anonymous_namespace)::schema> target;
  weak_ptr<(anonymous_namespace)::schema> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  json *pjVar2;
  
  pjVar2 = &(this->super_schema).default_value_;
  if ((this->super_schema).default_value_.m_type == null) {
    std::weak_ptr<(anonymous_namespace)::schema>::lock(&local_60);
    if (local_60.super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      std::operator+(&local_50,"unresolved or freed schema-reference ",&this->id_);
      (*e->_vptr_error_handler[2])(e,ptr,instance,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      iVar1 = (*(local_60.
                 super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->_vptr_schema[4])
                        (local_60.
                         super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,ptr,instance,e);
      pjVar2 = (json *)CONCAT44(extraout_var,iVar1);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_60.super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return pjVar2;
}

Assistant:

const json &default_value(const json::json_pointer &ptr, const json &instance, error_handler &e) const override final
	{
		if (!default_value_.is_null())
			return default_value_;

		auto target = target_.lock();
		if (target)
			return target->default_value(ptr, instance, e);

		e.error(ptr, instance, "unresolved or freed schema-reference " + id_);

		return default_value_;
	}